

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O0

TokenInfo * __thiscall Lexer::token(Lexer *this)

{
  bool bVar1;
  reference pTVar2;
  bool local_12;
  bool local_11;
  Lexer *local_10;
  Lexer *this_local;
  
  local_10 = this;
  bVar1 = hasValidToken(this);
  if (!bVar1) {
    local_11 = hasValidToken(this);
    local_12 = true;
    error<bool,bool>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/lexer.h:86: hasValidToken() (%1) does not equal true (%2)"
                     ,&local_11,&local_12);
  }
  pTVar2 = std::_Deque_iterator<Lexer::TokenInfo,_Lexer::TokenInfo_&,_Lexer::TokenInfo_*>::operator*
                     (&this->m_tokenPosition);
  return pTVar2;
}

Assistant:

inline TokenInfo* token() const
	{
		ASSERT (hasValidToken());
		return &(*m_tokenPosition);
	}